

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O0

void f(int *i)

{
  ostream *poVar1;
  int *in_RDI;
  rep_conflict rVar2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff68;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff70;
  duration<double,_std::ratio<1L,_1L>_> local_48 [2];
  undefined8 local_38;
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28 [4];
  int *local_8;
  
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f begin: ");
  local_38 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1206e9);
  mywait((float)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  do {
  } while (*local_8 == 0);
  *local_8 = 10;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x120823);
  return;
}

Assistant:

void f(volatile int &i) {
  LOG("f begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  
  // This is just used to make a delay
  mywait(1.0);
  
  while (!i) {
    /* wait */
  }
  
  i = 10;
  
  LOG("f finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}